

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  Construct *this;
  BasicBlock **ppBVar1;
  size_type *psVar2;
  ulong *puVar3;
  uint uVar4;
  pointer ppVar5;
  pointer ppBVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ConstructType CVar11;
  uint id;
  spv_result_t sVar12;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar13;
  mapped_type *pmVar14;
  Instruction *pIVar15;
  BasicBlock *pBVar16;
  BasicBlock *pBVar17;
  Instruction *inst;
  long *plVar18;
  const_iterator cVar19;
  undefined8 uVar20;
  Instruction *pIVar21;
  ConstructType type;
  ConstructType type_00;
  pointer ppBVar22;
  ulong *puVar23;
  uint32_t merge_block_id;
  pointer ppVar24;
  spv_result_t unaff_R14D;
  bool bVar25;
  char cVar26;
  pair<spvtools::val::BasicBlock_*,_bool> pVar27;
  uint32_t header_block;
  uint32_t loop_header_id;
  BasicBlock *pred;
  uint32_t back_edge_block;
  ConstructBlockSet construct_blocks;
  BasicBlock *succ;
  BasicBlock *merge_block;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  spv_result_t local_41c;
  undefined1 local_410 [32];
  undefined1 local_3f0 [32];
  BasicBlock *local_3d0;
  undefined1 local_3c8 [32];
  Instruction *local_3a8;
  string local_3a0;
  undefined1 local_380 [8];
  pointer local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [2];
  Instruction *local_350;
  undefined1 local_348 [32];
  Function *local_328;
  string local_320;
  BasicBlock **local_300;
  long local_2f8;
  BasicBlock *local_2f0;
  long lStack_2e8;
  BasicBlock *local_2e0;
  long local_2d8;
  pointer local_2d0;
  BasicBlock *pBStack_2c8;
  uint local_2bc;
  undefined1 local_2b8 [32];
  BasicBlock *local_298;
  pointer local_290;
  BasicBlock *local_288;
  _Base_bitset<1UL> _Stack_280;
  BasicBlock *local_278;
  BasicBlock *local_270;
  Instruction *local_268;
  _Rb_tree_node_base *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [24];
  spv_result_t local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar24 = (back_edges->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar25 = ppVar24 == ppVar5;
  local_328 = function;
  local_278 = (BasicBlock *)postorder;
  local_270 = (BasicBlock *)back_edges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_41c = unaff_R14D;
  if (!bVar25) {
    do {
      local_3a0._M_dataplus._M_p._0_4_ = (*ppVar24).first;
      merge_block_id = (*ppVar24).second;
      local_410._0_4_ = merge_block_id;
      bVar8 = Function::IsBlockType(local_328,merge_block_id,kBlockTypeLoop);
      if (bVar8) {
        local_238._0_8_ =
             std::
             map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&local_60,(key_type *)local_410);
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_238._0_8_,&local_3a0,(DiagnosticStream *)local_238);
      }
      else {
        pIVar15 = ValidationState_t::FindDef(_,(uint)local_3a0._M_dataplus._M_p);
        ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Back-edges (",0xc);
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)local_380,_,(uint)local_3a0._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,(char *)local_380,(long)local_378);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238," -> ",4);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,local_410._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,(char *)local_3f0._0_8_,local_3f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,") can only be formed between a block and a loop header.",
                   0x37);
        local_41c = local_68;
        if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
          operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
        }
        if (local_380 != (undefined1  [8])local_370) {
          operator_delete((void *)local_380,
                          CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                   local_370[0]._M_local_buf[0]) + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
      }
      if (!bVar8) break;
      ppVar24 = ppVar24 + 1;
      bVar25 = ppVar24 == ppVar5;
    } while (!bVar25);
  }
  if (bVar25) {
    pvVar13 = Function::ordered_blocks(local_328);
    ppBVar22 = (pvVar13->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppBVar6 = (pvVar13->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar25 = ppBVar22 == ppBVar6;
    if (!bVar25) {
      do {
        pBVar16 = *ppBVar22;
        iVar10 = 5;
        if ((pBVar16->structurally_reachable_ == true) &&
           (((pBVar16->type_).super__Base_bitset<1UL>._M_w & 4) != 0)) {
          local_3f0._0_4_ = pBVar16->id_;
          pmVar14 = std::
                    map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&local_60,(key_type *)local_3f0);
          iVar10 = 0;
          if ((pmVar14->_M_h)._M_element_count != 1) {
            pIVar15 = ValidationState_t::FindDef(_,local_3f0._0_4_);
            ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,"Loop header ",0xc);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_380,_,local_3f0._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,(char *)local_380,(long)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238," is targeted by ",0x10);
            std::ostream::_M_insert<unsigned_long>((ulong)local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,
                       " back-edge blocks but the standard requires exactly one",0x37);
            local_41c = local_68;
            if (local_380 != (undefined1  [8])local_370) {
              operator_delete((void *)local_380,
                              CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                       local_370[0]._M_local_buf[0]) + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
            iVar10 = 1;
          }
        }
        if ((iVar10 != 5) && (iVar10 != 0)) break;
        ppBVar22 = ppBVar22 + 1;
        bVar25 = ppBVar22 == ppBVar6;
      } while (!bVar25);
    }
    if (bVar25) {
      local_268 = (Instruction *)Function::constructs_abi_cxx11_(local_328);
      pIVar15 = (Instruction *)
                (local_268->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pIVar15 == local_268) {
        bVar25 = true;
      }
      else {
        do {
          puVar23 = (ulong *)(local_410 + 0x10);
          this = (Construct *)
                 &(pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          pBVar16 = Construct::entry_block(this);
          cVar26 = '\a';
          if (pBVar16->structurally_reachable_ == true) {
            pBVar17 = Construct::exit_block(this);
            if (pBVar17 == (BasicBlock *)0x0) {
              local_380 = (undefined1  [8])local_370;
              local_378 = (pointer)0x0;
              local_370[0]._M_local_buf[0] = '\0';
              local_3f0._0_8_ = local_3f0 + 0x10;
              local_3f0._8_8_ = (pointer)0x0;
              local_3f0[0x10] = '\0';
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
              local_3a0._M_string_length = 0;
              local_3a0.field_2._M_local_buf[0] = '\0';
              CVar11 = Construct::type(this);
              ConstructNames_abi_cxx11_
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_238,(val *)(ulong)CVar11,type);
              local_410._0_8_ = &local_3a0;
              local_410._8_8_ = local_3f0;
              local_410._16_8_ = local_380;
              std::
              _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
              _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          *)local_410,
                         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_p != local_1e8) {
                operator_delete(local_1f8._M_p,local_1e8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_p != &local_208) {
                operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
              }
              if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_238._0_8_ !=
                  (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(local_238 + 0x10)) {
                operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
              }
              pIVar21 = ValidationState_t::FindDef(_,pBVar16->id_);
              ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INTERNAL,pIVar21);
              std::operator+(&local_258,"Construct ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_380);
              plVar18 = (long *)std::__cxx11::string::append((char *)&local_258);
              local_298 = (BasicBlock *)&local_288;
              pBVar17 = (BasicBlock *)(plVar18 + 2);
              if ((BasicBlock *)*plVar18 == pBVar17) {
                local_288 = *(BasicBlock **)pBVar17;
                _Stack_280._M_w = plVar18[3];
              }
              else {
                local_288 = *(BasicBlock **)pBVar17;
                local_298 = (BasicBlock *)*plVar18;
              }
              local_290 = (pointer)plVar18[1];
              *plVar18 = (long)pBVar17;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::_M_append((char *)&local_298,local_3f0._0_8_);
              ppBVar1 = (BasicBlock **)(plVar18 + 2);
              if ((BasicBlock **)*plVar18 == ppBVar1) {
                local_2f0 = *ppBVar1;
                lStack_2e8 = plVar18[3];
                local_300 = &local_2f0;
              }
              else {
                local_2f0 = *ppBVar1;
                local_300 = (BasicBlock **)*plVar18;
              }
              local_2f8 = plVar18[1];
              *plVar18 = (long)ppBVar1;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::append((char *)&local_300);
              pBVar17 = (BasicBlock *)(plVar18 + 2);
              if ((BasicBlock *)*plVar18 == pBVar17) {
                local_2d0 = *(pointer *)pBVar17;
                pBStack_2c8 = (BasicBlock *)plVar18[3];
                local_2e0 = (BasicBlock *)&local_2d0;
              }
              else {
                local_2d0 = *(pointer *)pBVar17;
                local_2e0 = (BasicBlock *)*plVar18;
              }
              local_2d8 = plVar18[1];
              *plVar18 = (long)pBVar17;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2b8,_,pBVar16->id_);
              ppBVar22 = (pointer)0xf;
              if (local_2e0 != (BasicBlock *)&local_2d0) {
                ppBVar22 = local_2d0;
              }
              if (ppBVar22 < (pointer)(local_2b8._8_8_ + local_2d8)) {
                ppBVar22 = (pointer)0xf;
                if ((BasicBlock *)local_2b8._0_8_ != (BasicBlock *)(local_2b8 + 0x10)) {
                  ppBVar22 = (pointer)local_2b8._16_8_;
                }
                if (ppBVar22 < (pointer)(local_2b8._8_8_ + local_2d8)) goto LAB_0065ca09;
                plVar18 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_2b8,0,(char *)0x0,(ulong)local_2e0);
              }
              else {
LAB_0065ca09:
                plVar18 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_2e0,local_2b8._0_8_);
              }
              local_348._0_8_ = local_348 + 0x10;
              pBVar16 = (BasicBlock *)(plVar18 + 2);
              if ((BasicBlock *)*plVar18 == pBVar16) {
                local_348._16_8_ = *(undefined8 *)pBVar16;
                local_348._24_8_ = plVar18[3];
              }
              else {
                local_348._16_8_ = *(undefined8 *)pBVar16;
                local_348._0_8_ = (BasicBlock *)*plVar18;
              }
              local_348._8_8_ = plVar18[1];
              *plVar18 = (long)pBVar16;
              plVar18[1] = 0;
              *(undefined1 *)&pBVar16->id_ = 0;
              plVar18 = (long *)std::__cxx11::string::append(local_348);
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              psVar2 = (size_type *)(plVar18 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar18 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar2) {
                local_320.field_2._M_allocated_capacity = *psVar2;
                local_320.field_2._8_8_ = plVar18[3];
              }
              else {
                local_320.field_2._M_allocated_capacity = *psVar2;
                local_320._M_dataplus._M_p = (pointer)*plVar18;
              }
              local_320._M_string_length = plVar18[1];
              *plVar18 = (long)psVar2;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_320,(ulong)local_3a0._M_dataplus._M_p);
              pBVar16 = (BasicBlock *)(plVar18 + 2);
              if ((BasicBlock *)*plVar18 == pBVar16) {
                local_3c8._16_8_ = *(undefined8 *)pBVar16;
                local_3c8._24_8_ = plVar18[3];
                local_3c8._0_8_ = (BasicBlock *)(local_3c8 + 0x10);
              }
              else {
                local_3c8._16_8_ = *(undefined8 *)pBVar16;
                local_3c8._0_8_ = (BasicBlock *)*plVar18;
              }
              local_3c8._8_8_ = plVar18[1];
              *plVar18 = (long)pBVar16;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::append(local_3c8);
              puVar3 = (ulong *)(plVar18 + 2);
              if ((ulong *)*plVar18 == puVar3) {
                local_410._16_8_ = *puVar3;
                local_410._24_8_ = plVar18[3];
                local_410._0_8_ = puVar23;
              }
              else {
                local_410._16_8_ = *puVar3;
                local_410._0_8_ = (ulong *)*plVar18;
              }
              local_410._8_8_ = plVar18[1];
              *plVar18 = (long)puVar3;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,(char *)local_410._0_8_,local_410._8_8_);
              local_41c = local_68;
              if ((ulong *)local_410._0_8_ != puVar23) {
                operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
              }
              if ((BasicBlock *)local_3c8._0_8_ != (BasicBlock *)(local_3c8 + 0x10)) {
                operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              if ((BasicBlock *)local_348._0_8_ != (BasicBlock *)(local_348 + 0x10)) {
                operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
              }
              if ((BasicBlock *)local_2b8._0_8_ != (BasicBlock *)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
              }
              if (local_2e0 != (BasicBlock *)&local_2d0) {
                operator_delete(local_2e0,(long)local_2d0 + 1);
              }
              if (local_300 != &local_2f0) {
                operator_delete(local_300,(ulong)((long)&local_2f0->id_ + 1));
              }
              if (local_298 != (BasicBlock *)&local_288) {
                operator_delete(local_298,(ulong)((long)&local_288->id_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                         local_3a0.field_2._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
                operator_delete((void *)local_3f0._0_8_,
                                CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
              }
              if (local_380 != (undefined1  [8])local_370) {
                operator_delete((void *)local_380,
                                CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                         local_370[0]._M_local_buf[0]) + 1);
              }
            }
            else {
              local_3a8 = (Instruction *)this;
              bVar25 = BasicBlock::structurally_dominates(pBVar16,pBVar17);
              pIVar21 = local_3a8;
              if (bVar25) {
                if ((pBVar16 == pBVar17) &&
                   (((ulong)(local_3a8->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xfffffffd) == 1)) {
                  inst = ValidationState_t::FindDef(_,pBVar17->id_);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,inst);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,pBVar16->id_);
                  ValidationState_t::getIdName_abi_cxx11_(&local_3a0,_,pBVar17->id_);
                  local_410._0_8_ = local_410 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_410,"does not strictly structurally dominate","");
                  ConstructErrorString
                            ((string *)local_380,(Construct *)pIVar21,(string *)local_3f0,&local_3a0
                             ,(string *)local_410);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,(char *)local_380,(long)local_378);
                  local_41c = local_68;
                  if (local_380 != (undefined1  [8])local_370) {
                    operator_delete((void *)local_380,
                                    CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                             local_370[0]._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
LAB_0065be35:
                    operator_delete(local_3a0._M_dataplus._M_p,
                                    CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                             local_3a0.field_2._M_local_buf[0]) + 1);
                  }
                }
                else {
                  CVar11 = Construct::type((Construct *)local_3a8);
                  if ((CVar11 != kContinue) ||
                     (bVar25 = BasicBlock::structurally_postdominates(pBVar17,pBVar16), bVar25)) {
                    pIVar21 = local_3a8;
                    Construct::blocks((ConstructBlockSet *)local_380,(Construct *)local_3a8,
                                      local_328);
                    local_3f0._0_8_ = local_3f0 + 0x10;
                    local_3f0._8_8_ = (pointer)0x0;
                    local_3f0[0x10] = '\0';
                    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                    local_3a0._M_string_length = 0;
                    local_3a0.field_2._M_local_buf[0] = '\0';
                    local_410._0_8_ = local_410 + 0x10;
                    local_410._8_8_ = (BasicBlock *)0x0;
                    local_410._16_8_ = local_410._16_8_ & 0xffffffffffffff00;
                    CVar11 = Construct::type((Construct *)pIVar21);
                    ConstructNames_abi_cxx11_
                              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_238,(val *)(ulong)CVar11,type_00);
                    local_3c8._0_8_ = local_410;
                    local_3c8._8_8_ = &local_3a0;
                    local_3c8._16_8_ = local_3f0;
                    std::
                    _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                    ::_M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                *)local_3c8,
                               (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_238);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_p != local_1e8) {
                      operator_delete(local_1f8._M_p,local_1e8[0]._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_p != &local_208) {
                      operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
                    }
                    if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)local_238._0_8_ !=
                        (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)(local_238 + 0x10)) {
                      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
                    }
                    cVar26 = '\b';
                    uVar20 = local_370[0]._8_8_;
                    pIVar21 = pIVar15;
                    if ((_Rb_tree_node_base *)local_370[0]._8_8_ != (_Rb_tree_node_base *)&local_378
                       ) {
                      do {
                        local_350 = pIVar21;
                        local_3d0 = pBVar16;
                        pBVar16 = *(BasicBlock **)(uVar20 + 0x20);
                        ppBVar22 = (pBVar16->successors_).
                                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        ppBVar6 = (pBVar16->successors_).
                                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        local_260 = (_Rb_tree_node_base *)uVar20;
                        while( true ) {
                          bVar25 = ppBVar22 == ppBVar6;
                          if (bVar25) break;
                          local_348._0_8_ = *ppBVar22;
                          cVar19 = std::
                                   _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                           *)local_380,(key_type *)local_348);
                          bVar8 = true;
                          if ((cVar19._M_node == (_Base_ptr)&local_378) &&
                             (bVar9 = Construct::IsStructuredExit
                                                ((Construct *)local_3a8,_,
                                                 (BasicBlock *)local_348._0_8_), !bVar9)) {
                            pIVar15 = ValidationState_t::FindDef(_,pBVar16->id_);
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15
                                      );
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238,"block <ID> ",0xb);
                            ValidationState_t::getIdName_abi_cxx11_
                                      ((string *)local_3c8,_,pBVar16->id_);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238,(char *)local_3c8._0_8_,local_3c8._8_8_)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238," exits the ",0xb);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238,(char *)local_3f0._0_8_,local_3f0._8_8_)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238," headed by <ID> ",0x10);
                            ValidationState_t::getIdName_abi_cxx11_(&local_320,_,local_3d0->id_);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238,local_320._M_dataplus._M_p,
                                       local_320._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_238,", but not via a structured exit",0x1f);
                            local_41c = local_68;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
                              operator_delete(local_320._M_dataplus._M_p,
                                              local_320.field_2._M_allocated_capacity + 1);
                            }
                            if ((BasicBlock *)local_3c8._0_8_ != (BasicBlock *)(local_3c8 + 0x10)) {
                              operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1))
                              ;
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                            bVar8 = false;
                          }
                          if (!bVar8) {
                            cVar26 = '\x01';
                            goto LAB_0065c499;
                          }
                          ppBVar22 = ppBVar22 + 1;
                        }
                        cVar26 = '\n';
LAB_0065c499:
                        pIVar15 = local_350;
                        if (bVar25) {
                          if (pBVar16 == local_3d0) {
                            cVar26 = '\t';
                          }
                          else {
                            ppBVar22 = (pBVar16->predecessors_).
                                       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                            ppBVar6 = (pBVar16->predecessors_).
                                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                            while( true ) {
                              bVar25 = ppBVar22 == ppBVar6;
                              if (bVar25) break;
                              local_3c8._0_8_ = *ppBVar22;
                              bVar8 = true;
                              if ((((BasicBlock *)local_3c8._0_8_)->structurally_reachable_ == true)
                                 && (cVar19 = std::
                                              _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                              ::find((
                                                  _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                                  *)local_380,(key_type *)local_3c8),
                                    cVar19._M_node == (_Base_ptr)&local_378)) {
                                pIVar15 = ValidationState_t::FindDef(_,*(uint32_t *)local_3c8._0_8_)
                                ;
                                ValidationState_t::diag
                                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                           pIVar15);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,"block <ID> ",0xb);
                                std::ostream::_M_insert<unsigned_long>((ulong)local_238);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," branches to the ",0x11);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_3f0._0_8_,
                                           local_3f0._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," construct, but not to the ",0x1b);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,local_3a0._M_dataplus._M_p,
                                           local_3a0._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," <ID> ",6);
                                std::ostream::_M_insert<unsigned_long>((ulong)local_238);
                                local_41c = local_68;
                                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                                bVar8 = false;
                              }
                              if (!bVar8) {
                                cVar26 = '\x01';
                                goto LAB_0065c657;
                              }
                              ppBVar22 = ppBVar22 + 1;
                            }
                            cVar26 = '\f';
LAB_0065c657:
                            pIVar15 = local_350;
                            if (((bVar25) &&
                                (cVar26 = '\0',
                                ((pBVar16->type_).super__Base_bitset<1UL>._M_w & 6) != 0)) &&
                               ((pBVar16->terminator_[-1].inst_.opcode & 0xfffe) == 0xf6)) {
                              cVar26 = '\0';
                              local_2bc = Instruction::GetOperandAs<unsigned_int>
                                                    (pBVar16->terminator_ + -1,0);
                              pVar27 = Function::GetBlock(local_328,local_2bc);
                              local_2e0 = pVar27.first;
                              if ((local_2e0->structurally_reachable_ == true) &&
                                 (cVar19 = std::
                                           _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                           ::find((
                                                  _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                                  *)local_380,&local_2e0),
                                 cVar19._M_node == (_Base_ptr)&local_378)) {
                                pIVar21 = ValidationState_t::FindDef(_,pBVar16->id_);
                                ValidationState_t::diag
                                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                           pIVar21);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,"Header block ",0xd);
                                ValidationState_t::getIdName_abi_cxx11_
                                          ((string *)local_3c8,_,pBVar16->id_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_3c8._0_8_,
                                           local_3c8._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," is contained in the ",0x15);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_3f0._0_8_,
                                           local_3f0._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," construct headed by ",0x15);
                                ValidationState_t::getIdName_abi_cxx11_(&local_320,_,local_3d0->id_)
                                ;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,local_320._M_dataplus._M_p,
                                           local_320._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,", but its merge block ",0x16);
                                ValidationState_t::getIdName_abi_cxx11_
                                          ((string *)local_348,_,local_2bc);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_348._0_8_,
                                           local_348._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238," is not",7);
                                local_41c = local_68;
                                if ((BasicBlock *)local_348._0_8_ !=
                                    (BasicBlock *)(local_348 + 0x10)) {
                                  operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                                  operator_delete(local_320._M_dataplus._M_p,
                                                  local_320.field_2._M_allocated_capacity + 1);
                                }
                                if ((BasicBlock *)local_3c8._0_8_ !=
                                    (BasicBlock *)(local_3c8 + 0x10)) {
                                  operator_delete((void *)local_3c8._0_8_,
                                                  (ulong)(local_3c8._16_8_ + 1));
                                }
                                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                                cVar26 = '\x01';
                              }
                            }
                          }
                        }
                        if ((cVar26 != '\t') && (pBVar16 = local_3d0, cVar26 != '\0'))
                        goto LAB_0065cec7;
                        uVar20 = std::_Rb_tree_increment(local_260);
                        pBVar16 = local_3d0;
                        pIVar21 = local_350;
                      } while ((_Rb_tree_node_base *)uVar20 != (_Rb_tree_node_base *)&local_378);
                      cVar26 = '\b';
                    }
LAB_0065cec7:
                    pIVar21 = local_3a8;
                    if (cVar26 == '\b') {
                      CVar11 = Construct::type((Construct *)local_3a8);
                      if (CVar11 == kLoop) {
                        id = Instruction::GetOperandAs<unsigned_int>(pBVar16->terminator_ + -1,1);
                        pIVar21 = ValidationState_t::FindDef(_,id);
                        cVar26 = '\0';
                        if (pBVar16->id_ != id) {
                          ppBVar6 = ((pIVar21[1].block_)->predecessors_).
                                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          ppBVar22 = ((pIVar21[1].block_)->predecessors_).
                                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          local_3d0 = pBVar16;
                          pIVar21 = local_350;
                          for (; local_350 = pIVar15, cVar26 = '\x0e', pIVar15 = local_350,
                              ppBVar22 != ppBVar6; ppBVar22 = ppBVar22 + 1) {
                            local_2e0 = *ppBVar22;
                            cVar26 = '\x0f';
                            if (local_2e0->structurally_reachable_ == true) {
                              cVar26 = '\0';
                              bVar25 = false;
                              for (pBVar16 = *(BasicBlock **)local_270;
                                  pBVar16 != local_270->immediate_dominator_;
                                  pBVar16 = (BasicBlock *)&pBVar16->immediate_dominator_) {
                                uVar4 = pBVar16->id_;
                                uVar7 = *(uint *)&pBVar16->field_0x4;
                                if ((id == uVar7) && (local_2e0->id_ == uVar4)) {
                                  bVar25 = true;
                                }
                              }
                              cVar19 = std::
                                       _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                       ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                               *)local_380,&local_2e0);
                              if ((cVar19._M_node == (_Base_ptr)&local_378) &&
                                 (cVar26 = '\0', !bVar25)) {
                                ValidationState_t::diag
                                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                           local_2e0->terminator_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,"Block ",6);
                                ValidationState_t::getIdName_abi_cxx11_
                                          ((string *)local_3c8,_,local_2e0->id_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_3c8._0_8_,
                                           local_3c8._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,
                                           " branches to the loop continue target ",0x26);
                                ValidationState_t::getIdName_abi_cxx11_(&local_320,_,id);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,local_320._M_dataplus._M_p,
                                           local_320._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,
                                           ", but is not contained in the associated loop construct "
                                           ,0x38);
                                ValidationState_t::getIdName_abi_cxx11_
                                          ((string *)local_348,_,local_3d0->id_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_238,(char *)local_348._0_8_,
                                           local_348._8_8_);
                                local_41c = local_68;
                                if ((BasicBlock *)local_348._0_8_ !=
                                    (BasicBlock *)(local_348 + 0x10)) {
                                  operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                                  operator_delete(local_320._M_dataplus._M_p,
                                                  local_320.field_2._M_allocated_capacity + 1);
                                }
                                if ((BasicBlock *)local_3c8._0_8_ !=
                                    (BasicBlock *)(local_3c8 + 0x10)) {
                                  operator_delete((void *)local_3c8._0_8_,
                                                  (ulong)(local_3c8._16_8_ + 1));
                                }
                                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                                cVar26 = '\x01';
                              }
                            }
                            pIVar21 = local_350;
                            if ((cVar26 != '\x0f') && (pIVar15 = local_350, cVar26 != '\0')) break;
                            pIVar15 = local_350;
                          }
                          local_350 = pIVar21;
                          pBVar16 = local_3d0;
                          if (cVar26 == '\x0e') {
                            cVar26 = '\0';
                          }
                        }
                        pIVar21 = local_3a8;
                        if (cVar26 != '\0') goto LAB_0065d1d4;
                      }
                      CVar11 = Construct::type((Construct *)pIVar21);
                      cVar26 = '\0';
                      if ((CVar11 == kSelection) && ((pBVar16->terminator_->inst_).opcode == 0xfb))
                      {
                        sVar12 = StructuredSwitchChecks(_,local_328,(Construct *)pIVar21);
                        cVar26 = sVar12 != SPV_SUCCESS;
                        if ((bool)cVar26) {
                          local_41c = sVar12;
                        }
                      }
                    }
LAB_0065d1d4:
                    if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      operator_delete(local_3a0._M_dataplus._M_p,
                                      CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                               local_3a0.field_2._M_local_buf[0]) + 1);
                    }
                    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
                      operator_delete((void *)local_3f0._0_8_,
                                      CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
                    }
                    std::
                    _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ::_M_erase((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                *)local_380,
                               (_Link_type)
                               CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                        local_370[0]._M_local_buf[0]));
                    goto LAB_0065cd5e;
                  }
                  pIVar21 = ValidationState_t::FindDef(_,pBVar17->id_);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar21);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,pBVar16->id_);
                  ValidationState_t::getIdName_abi_cxx11_(&local_3a0,_,pBVar17->id_);
                  local_410._0_8_ = local_410 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_410,"is not structurally post dominated by","");
                  ConstructErrorString
                            ((string *)local_380,(Construct *)local_3a8,(string *)local_3f0,
                             &local_3a0,(string *)local_410);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,(char *)local_380,(long)local_378);
                  local_41c = local_68;
                  if (local_380 != (undefined1  [8])local_370) {
                    operator_delete((void *)local_380,
                                    CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                             local_370[0]._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) goto LAB_0065be35;
                }
                if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
LAB_0065c134:
                  operator_delete((void *)local_3f0._0_8_,
                                  CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
                }
              }
              else {
                pIVar21 = ValidationState_t::FindDef(_,pBVar17->id_);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar21);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,pBVar16->id_);
                ValidationState_t::getIdName_abi_cxx11_(&local_3a0,_,pBVar17->id_);
                local_410._0_8_ = puVar23;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_410,"does not structurally dominate","");
                ConstructErrorString
                          ((string *)local_380,(Construct *)local_3a8,(string *)local_3f0,&local_3a0
                           ,(string *)local_410);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,(char *)local_380,(long)local_378);
                local_41c = local_68;
                if (local_380 != (undefined1  [8])local_370) {
                  operator_delete((void *)local_380,
                                  CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                           local_370[0]._M_local_buf[0]) + 1);
                }
                if ((ulong *)local_410._0_8_ != puVar23) {
                  operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                  operator_delete(local_3a0._M_dataplus._M_p,
                                  CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                           local_3a0.field_2._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) goto LAB_0065c134;
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
            }
            cVar26 = '\x01';
          }
LAB_0065cd5e:
          if ((cVar26 != '\a') && (cVar26 != '\0')) goto LAB_0065d24f;
          pIVar15 = (Instruction *)
                    (((_List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                       *)&pIVar15->words_)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (pIVar15 != local_268);
        cVar26 = '\x06';
LAB_0065d24f:
        bVar25 = cVar26 == '\x06';
      }
      if (bVar25) {
        local_41c = ValidateStructuredSelections
                              (_,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                  *)local_278);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_41c;
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          if (!pred->structurally_reachable()) {
            continue;
          }
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      if (auto error = StructuredSwitchChecks(_, function, construct)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}